

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::ExtensionDirectiveTestCaseGroup::ExtensionDirectiveTestCase::iterate
          (ExtensionDirectiveTestCase *this)

{
  GLfloat GVar1;
  GLfloat GVar2;
  GLfloat GVar3;
  glClearColorFunc p_Var4;
  glUseProgramFunc p_Var5;
  glUniform4fFunc p_Var6;
  glGetUniformLocationFunc p_Var7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  GLenum GVar11;
  GLint GVar12;
  RenderContext *pRVar13;
  undefined4 extraout_var;
  TestLog *log_00;
  float *pfVar14;
  char *pcVar15;
  char *glslVersion;
  long lVar16;
  TestError *this_00;
  GLSLVersion glslVersion_00;
  char *extensionDirective;
  char *local_4a0;
  bool local_3e9;
  RGBA local_368;
  RGBA local_364;
  undefined1 local_35d;
  deUint8 local_35c [4];
  undefined1 local_358 [3];
  bool pass;
  GLubyte result [4];
  allocator<char> local_339;
  string local_338;
  undefined1 local_318 [8];
  VertexArrayBinding posBinding;
  undefined1 local_2c0 [5];
  bool pass_1;
  bool infoLogOk;
  allocator<char> local_299;
  string local_298;
  string local_278;
  ProgramSources local_258;
  undefined1 local_188 [8];
  ShaderProgram p;
  string frgSrc;
  string directive;
  Vec4 srcCol;
  undefined1 local_58 [8];
  Vec4 dstCol;
  FBOSentry fbo;
  int dim;
  TestLog *log;
  Functions *gl;
  ExtensionDirectiveTestCase *this_local;
  Functions *gl_00;
  
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar9 = (*pRVar13->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar9);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar8 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar8) {
    extensionDirective = (char *)0x8058;
    FBOSentry::FBOSentry((FBOSentry *)(dstCol.m_data + 2),gl_00,4,4,0x8058);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_58,1.0,1.0,1.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)((long)&directive.field_2 + 0xc),0.0,0.0,0.0,1.0);
    p_Var4 = gl_00->clearColor;
    pfVar14 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_58);
    GVar1 = *pfVar14;
    pfVar14 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_58);
    GVar2 = *pfVar14;
    pfVar14 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_58);
    GVar3 = *pfVar14;
    pfVar14 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_58);
    (*p_Var4)(GVar1,GVar2,GVar3,*pfVar14);
    (*gl_00->clear)(0x4000);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&frgSrc.field_2 + 8),"#extension GL_KHR_blend_equation_advanced : ",
                   &this->m_behaviourStr);
    pcVar15 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    glslVersion = (char *)std::__cxx11::string::c_str();
    GetSolidShader_abi_cxx11_
              ((string *)&p.m_program.m_info.linkTimeUs,(glcts *)"blend_support_multiply",pcVar15,
               glslVersion,extensionDirective);
    pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    GetDef2DVtxSrc_abi_cxx11_(&local_298,(glcts *)(ulong)this->m_glslVersion,glslVersion_00);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar15,&local_299);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2c0,pcVar15,(allocator<char> *)((long)&posBinding.pointer.data + 7));
    glu::makeVtxFragSources(&local_258,&local_278,(string *)local_2c0);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_188,pRVar13,&local_258);
    glu::ProgramSources::~ProgramSources(&local_258);
    std::__cxx11::string::~string((string *)local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&posBinding.pointer.data + 7));
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_298);
    if ((this->m_requireInfoLog & 1U) == 0) {
      local_3e9 = true;
    }
    else {
      glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_188,SHADERTYPE_FRAGMENT,0);
      lVar16 = std::__cxx11::string::size();
      local_3e9 = lVar16 != 0;
    }
    posBinding.pointer.data._6_1_ = local_3e9;
    bVar8 = glu::ShaderProgram::isOk((ShaderProgram *)local_188);
    if (bVar8) {
      p_Var5 = gl_00->useProgram;
      dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_188);
      (*p_Var5)(dVar10);
      GVar11 = (*gl_00->getError)();
      glu::checkError(GVar11,"Program failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                      ,0x46e);
      if ((posBinding.pointer.data._6_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail. No warnings were generated.");
        posBinding.pointer.data._0_4_ = 1;
      }
      else {
        (*gl_00->disable)(0xbd0);
        (*gl_00->enable)(0xbe2);
        (*gl_00->blendEquation)(0x9294);
        GVar11 = (*gl_00->getError)();
        glu::checkError(GVar11,"BlendEquation failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x47b);
        p_Var6 = gl_00->uniform4f;
        p_Var7 = gl_00->getUniformLocation;
        dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_188);
        GVar12 = (*p_Var7)(dVar10,"uSrcCol");
        pfVar14 = tcu::Vector<float,_4>::x((Vector<float,_4> *)((long)&directive.field_2 + 0xc));
        GVar1 = *pfVar14;
        pfVar14 = tcu::Vector<float,_4>::y((Vector<float,_4> *)((long)&directive.field_2 + 0xc));
        GVar2 = *pfVar14;
        pfVar14 = tcu::Vector<float,_4>::z((Vector<float,_4> *)((long)&directive.field_2 + 0xc));
        GVar3 = *pfVar14;
        pfVar14 = tcu::Vector<float,_4>::w((Vector<float,_4> *)((long)&directive.field_2 + 0xc));
        (*p_Var6)(GVar12,GVar1,GVar2,GVar3,*pfVar14);
        GVar11 = (*gl_00->getError)();
        glu::checkError(GVar11,"Uniform failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x480);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"aPos",&local_339);
        glu::va::Float((VertexArrayBinding *)local_318,&local_338,2,4,0,(float *)s_pos);
        std::__cxx11::string::~string((string *)&local_338);
        std::allocator<char>::~allocator(&local_339);
        GVar11 = (*gl_00->getError)();
        glu::checkError(GVar11,"Attributes failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x483);
        pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
        dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_188);
        glu::pr::Triangles((PrimitiveList *)local_358,6,(deUint16 *)s_indices);
        glu::draw(pRVar13,dVar10,1,(VertexArrayBinding *)local_318,(PrimitiveList *)local_358,
                  (DrawUtilCallback *)0x0);
        GVar11 = (*gl_00->getError)();
        glu::checkError(GVar11,"Draw failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x487);
        builtin_memcpy(local_35c,"\x01\x02\x03\x04",4);
        (*gl_00->readPixels)(0,0,1,1,0x1908,0x1401,local_35c);
        GVar11 = (*gl_00->getError)();
        glu::checkError(GVar11,"Read pixels failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x48c);
        local_364 = tcu::RGBA::fromBytes(local_35c);
        tcu::RGBA::RGBA(&local_368,0,0,0,0xff);
        local_35d = tcu::RGBA::operator==(&local_364,&local_368);
        if ((bool)local_35d) {
          local_4a0 = "Pass";
        }
        else {
          local_4a0 = "Fail";
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (uint)!(bool)local_35d,local_4a0);
        posBinding.pointer.data._0_4_ = 1;
        glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_318);
      }
    }
    else {
      if ((this->m_requireCompile & 1U) != 0) {
        glu::operator<<(log_00,(ShaderProgram *)local_188);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Compile failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                   ,0x462);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      posBinding.pointer.data._5_1_ = posBinding.pointer.data._6_1_ & 1;
      pcVar15 = "Fail. Expected info log.";
      if (posBinding.pointer.data._5_1_ != 0) {
        pcVar15 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~posBinding.pointer.data._5_1_ & QP_TEST_RESULT_FAIL,pcVar15);
      posBinding.pointer.data._0_4_ = 1;
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_188);
    std::__cxx11::string::~string((string *)&p.m_program.m_info.linkTimeUs);
    std::__cxx11::string::~string((string *)(frgSrc.field_2._M_local_buf + 8));
    FBOSentry::~FBOSentry((FBOSentry *)(dstCol.m_data + 2));
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

IterateResult iterate(void)
		{
			const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
			TestLog&			  log = m_testCtx.getLog();
			const int			  dim = 4;

			// Check that extension is supported.
			if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
				return STOP;
			}

			FBOSentry fbo(gl, dim, dim, GL_RGBA8);

			tcu::Vec4 dstCol(1.f, 1.f, 1.f, 1.f);
			tcu::Vec4 srcCol(0.f, 0.f, 0.f, 1.f);

			// Clear to destination color.
			gl.clearColor(dstCol.x(), dstCol.y(), dstCol.z(), dstCol.w());
			gl.clear(GL_COLOR_BUFFER_BIT);

			// Setup program.
			std::string directive = "#extension GL_KHR_blend_equation_advanced : " + m_behaviourStr;
			std::string frgSrc = GetSolidShader("blend_support_multiply", glu::getGLSLVersionDeclaration(m_glslVersion),
												directive.c_str());
			glu::ShaderProgram p(m_context.getRenderContext(),
								 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
			// If check that there is some info log if it is expected.
			const bool infoLogOk =
				m_requireInfoLog ? p.getShaderInfo(glu::SHADERTYPE_FRAGMENT).infoLog.size() > 0 : true;
			if (!p.isOk())
			{
				if (m_requireCompile)
				{
					log << p;
					TCU_FAIL("Compile failed");
				}
				else
				{
					// If shader was expected to fail, so assume info log has something.
					bool pass = infoLogOk;
					m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
											pass ? "Pass" : "Fail. Expected info log.");
				}
				return STOP;
			}
			gl.useProgram(p.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

			// Program ok, check whether info log was as expected.
			if (!infoLogOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail. No warnings were generated.");
				return STOP;
			}

			// Enable blending and set blend equation.
			gl.disable(GL_DITHER);
			gl.enable(GL_BLEND);
			gl.blendEquation(GL_MULTIPLY_KHR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

			// Setup source color.
			gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol.x(), srcCol.y(), srcCol.z(),
						 srcCol.w());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform failed");

			glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Attributes failed");

			glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

			// Check the result to see that extension was actually enabled.
			glw::GLubyte result[4] = { 1, 2, 3, 4 };
			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, result);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");
			bool pass = tcu::RGBA::fromBytes(result) == tcu::RGBA(0, 0, 0, 0xFF);
			m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");

			return STOP;
		}